

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::AddKel(TPZParFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
         *this,TPZFMatrix<std::complex<double>_> *elmat,TPZVec<long> *destinationindex)

{
  TPZFrontNonSym<std::complex<double>_> *this_00;
  int iVar1;
  TPZEqnArray<std::complex<double>_> *this_01;
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  long local_30;
  
  this_00 = &(this->
             super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
             ).fFront;
  TPZFrontNonSym<std::complex<double>_>::AddKel(this_00,elmat,destinationindex);
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  ::EquationsToDecompose
            (&this->
              super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
             ,destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    this_01 = (TPZEqnArray<std::complex<double>_> *)operator_new(0x51d0);
    TPZEqnArray<std::complex<double>_>::TPZEqnArray(this_01);
    TPZFrontNonSym<std::complex<double>_>::DecomposeEquations(this_00,local_30,local_38,this_01);
    TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
    ::CheckCompress(&this->
                     super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                   );
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->fwritelock);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    (*(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
      super_TPZVec<TPZEqnArray<std::complex<double>_>_*>._vptr_TPZVec[3])
              (&this->fEqnStack,
               (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
               super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fNElements + 1);
    (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
    super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fStore
    [(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>.
     super_TPZVec<TPZEqnArray<std::complex<double>_>_*>.fNElements + -1] = this_01;
    if (local_38 ==
        (this->
        super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
        ).super_TPZAbstractFrontMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>
        .super_TPZBaseMatrix.fRow + -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Decomposition finished",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      std::ostream::flush();
      FinishWriting(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->fwritelock);
    std::condition_variable::notify_all();
  }
  (this->
  super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  ).super_TPZAbstractFrontMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fDecomposed =
       (char)(this->
             super_TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
             ).fFront.super_TPZFront<std::complex<double>_>.fDecomposeType;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}